

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O2

void duckdb::ArraySliceFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  LogicalTypeId LVar2;
  idx_t source_count;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong *puVar5;
  ulong *puVar6;
  int64_t *piVar7;
  int64_t *piVar8;
  list_entry_t *plVar9;
  uint64_t *puVar10;
  uint64_t *puVar11;
  undefined8 uVar12;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  ulong uVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> count;
  bool bVar14;
  reference pvVar15;
  reference this;
  reference pvVar16;
  BoundFunctionExpression *pBVar17;
  pointer pFVar18;
  Vector *pVVar19;
  idx_t iVar20;
  idx_t iVar21;
  idx_t iVar22;
  long *plVar23;
  SelectionVector *pSVar24;
  SelectionVector *pSVar25;
  idx_t iVar26;
  NotImplementedException *this_00;
  SelectionVector *pSVar27;
  idx_t iVar28;
  TemplatedValidityMask<unsigned_long> *pTVar29;
  ulong uVar30;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  TemplatedValidityMask<unsigned_long> *pTVar31;
  byte bVar32;
  idx_t i;
  ulong uVar33;
  long lVar34;
  sel_t sVar35;
  idx_t i_2;
  anon_union_16_2_67f50693_for_value *paVar36;
  uint64_t uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  list_entry_t lVar41;
  anon_union_16_2_67f50693_for_value aVar42;
  list_entry_t lVar43;
  list_entry_t input_07;
  list_entry_t input_08;
  undefined6 in_stack_fffffffffffffe18;
  char cVar44;
  char cVar45;
  optional_ptr<duckdb::Vector,_true> local_1d0;
  list_entry_t sliced;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  anon_union_16_2_67f50693_for_value *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  SelectionVector sel;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  data_ptr_t local_178;
  optional_ptr<duckdb::Vector,_true> local_170;
  TemplatedValidityMask<unsigned_long> *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  list_entry_t str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [4];
  UnifiedVectorFormat step_data;
  UnifiedVectorFormat begin_data;
  UnifiedVectorFormat end_data;
  
  source_count = args->count;
  pvVar15 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  VectorOperations::Copy(pvVar15,result,source_count,0,0);
  if ((result->type).id_ == SQLNULL) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  pvVar15 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x1a0) {
    pvVar16 = vector<duckdb::Vector,_true>::get<true>(&args->data,3);
  }
  else {
    pvVar16 = (reference)0x0;
  }
  pBVar17 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar18 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar17->bind_info);
  cVar44 = *(char *)&pFVar18[4]._vptr_FunctionData;
  cVar45 = *(char *)((long)&pFVar18[4]._vptr_FunctionData + 1);
  bVar14 = DataChunk::AllConstant(args);
  Vector::SetVectorType(result,bVar14 * '\x02');
  LVar2 = (result->type).id_;
  if (LVar2 != VARCHAR) {
    if (LVar2 == BLOB) {
      if (pvVar16 == (reference)0x0) {
        pVVar19 = (Vector *)0x0;
      }
      else {
        pVVar19 = ListVector::GetEntry(result);
      }
      sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_178 = (data_ptr_t)0x0;
      sel.sel_vector = (sel_t *)0x0;
      sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (result->vector_type == CONSTANT_VECTOR) {
        puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar14 = false;
        }
        else {
          bVar14 = (*puVar3 & 1) == 0;
        }
        puVar3 = (pvVar15->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar39 = false;
        }
        else {
          bVar39 = (*puVar3 & 1) == 0;
        }
        puVar3 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar40 = false;
        }
        else {
          bVar40 = (*puVar3 & 1) == 0;
        }
        end_data.sel = (SelectionVector *)pVVar19;
        if (pvVar16 == (reference)0x0) {
          bVar32 = 0;
          begin_data.sel = (SelectionVector *)pvVar16;
        }
        else {
          begin_data.sel = (SelectionVector *)pvVar16;
          pVVar19 = optional_ptr<duckdb::Vector,_true>::operator*
                              ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          puVar3 = (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar32 = 1;
          }
          else {
            bVar32 = (byte)*puVar3 & 1;
          }
        }
        if (((bVar14 || bVar39) || bVar40) ||
           (begin_data.sel != (SelectionVector *)0x0 && bVar32 == 0)) {
          ConstantVector::SetNull(result,true);
        }
        else {
          local_1b0 = (anon_union_16_2_67f50693_for_value *)result->data;
          puVar5 = (ulong *)pvVar15->data;
          puVar6 = (ulong *)this->data;
          if (begin_data.sel == (SelectionVector *)0x0) {
            plVar23 = (long *)0x0;
          }
          else {
            pVVar19 = optional_ptr<duckdb::Vector,_true>::operator*
                                ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
            plVar23 = (long *)pVVar19->data;
          }
          uVar30 = *(ulong *)local_1b0;
          str.length = (uint64_t)(local_1b0->pointer).ptr;
          str.offset._0_4_ = (undefined4)uVar30;
          str.offset._4_4_ = (undefined4)(uVar30 >> 0x20);
          if (cVar44 == '\0') {
            step_data.sel = (SelectionVector *)*puVar5;
          }
          else {
            step_data.sel = (SelectionVector *)0x0;
          }
          if (cVar45 == '\0') {
            pSVar25 = (SelectionVector *)*puVar6;
            pSVar24 = pSVar25;
          }
          else {
            pSVar25 = (SelectionVector *)0x0;
            pSVar24 = (SelectionVector *)(uVar30 & 0xffffffff);
          }
          sliced.offset._0_4_ = SUB84(pSVar24,0);
          sliced.offset._4_4_ = (undefined4)((ulong)pSVar24 >> 0x20);
          bVar14 = true;
          if (plVar23 == (long *)0x0) {
            lVar34 = 1;
            bVar39 = true;
LAB_01e19054:
            ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                      ((string_t *)&str,(long *)&step_data,(long *)&sliced);
          }
          else {
            lVar34 = *plVar23;
            if (lVar34 < 0) {
              if (cVar44 != '\0') {
                step_data.sel = (SelectionVector *)(uVar30 & 0xffffffff);
              }
              sliced.offset._0_4_ = SUB84(step_data.sel,0);
              sliced.offset._4_4_ = (undefined4)((ulong)step_data.sel >> 0x20);
              step_data.sel = pSVar25;
            }
            bVar39 = lVar34 == 1;
            if ((bVar32 | bVar39) == 1) goto LAB_01e19054;
            bVar14 = false;
            bVar39 = false;
          }
          if ((bVar32 == 1 && lVar34 != 1) &&
             ((long)step_data.sel < (long)CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset)))
          {
            iVar26 = CalculateSliceLength<long>
                               ((idx_t)step_data.sel,
                                CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar34,true)
            ;
            bVar40 = true;
            SelectionVector::Initialize(&sel,iVar26);
          }
          else {
            bVar40 = false;
            iVar26 = 0;
          }
          if (bVar14) {
            input_04.value._4_1_ = str.offset._4_1_;
            input_04.value._5_1_ = str.offset._5_1_;
            input_04.value._6_1_ = str.offset._6_1_;
            input_04.value._7_1_ = str.offset._7_1_;
            input_04.value.pointer.length = (undefined4)str.offset;
            input_04.value.pointer.ptr = (char *)str.length;
            input_03.value._4_1_ = str.offset._4_1_;
            input_03.value._5_1_ = str.offset._5_1_;
            input_03.value._6_1_ = str.offset._6_1_;
            input_03.value._7_1_ = str.offset._7_1_;
            input_03.value.pointer.length = (undefined4)str.offset;
            input_03.value.pointer.ptr = (char *)str.length;
            if (bVar39) {
              aVar42.pointer =
                   (anon_struct_16_3_d7536bce_for_pointer)
                   BlobSliceOperations::SliceValue
                             (result,input_03,(int64_t)step_data.sel,
                              CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset));
            }
            else {
              aVar42.pointer =
                   (anon_struct_16_3_d7536bce_for_pointer)
                   BlobSliceOperations::SliceValueWithSteps
                             (result,&sel,input_04,(int64_t)step_data.sel,
                              CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar34,
                              (idx_t *)&local_178);
            }
            local_1b0->pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar42;
          }
          else {
            ConstantVector::SetNull(result,true);
          }
          if (bVar40) {
            pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->
                                ((optional_ptr<duckdb::Vector,_true> *)&end_data);
            Vector::Slice(pVVar19,&sel,iVar26);
            pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->
                                ((optional_ptr<duckdb::Vector,_true> *)&end_data);
            Vector::Flatten(pVVar19,iVar26);
            ListVector::SetListSize(result,iVar26);
          }
        }
      }
      else {
        local_1d0.ptr = pvVar16;
        local_170.ptr = pVVar19;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
        UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
        UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
        UnifiedVectorFormat::UnifiedVectorFormat(&step_data);
        Vector::ToUnifiedFormat(result,source_count,(UnifiedVectorFormat *)&str);
        Vector::ToUnifiedFormat(pvVar15,source_count,&begin_data);
        Vector::ToUnifiedFormat(this,source_count,&end_data);
        if (local_1d0.ptr != (reference)0x0) {
          pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->(&local_1d0);
          Vector::ToUnifiedFormat(pVVar19,source_count,&step_data);
          iVar26 = ListVector::GetListSize(result);
          SelectionVector::Initialize(&sel,iVar26);
        }
        pdVar4 = result->data;
        FlatVector::VerifyFlatVector(result);
        paVar36 = (anon_union_16_2_67f50693_for_value *)(pdVar4 + 8);
        local_168 = (TemplatedValidityMask<unsigned_long> *)0x0;
        for (iVar26 = 0; pTVar31 = local_168, source_count != iVar26; iVar26 = iVar26 + 1) {
          iVar22 = iVar26;
          if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
            iVar22 = (idx_t)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                     iVar26 * 4);
          }
          iVar21 = iVar26;
          if ((begin_data.sel)->sel_vector != (sel_t *)0x0) {
            iVar21 = (idx_t)(begin_data.sel)->sel_vector[iVar26];
          }
          iVar20 = iVar26;
          if ((end_data.sel)->sel_vector != (sel_t *)0x0) {
            iVar20 = (idx_t)(end_data.sel)->sel_vector[iVar26];
          }
          if (local_1d0.ptr == (reference)0x0) {
            iVar28 = 0;
          }
          else {
            iVar28 = iVar26;
            if ((step_data.sel)->sel_vector != (sel_t *)0x0) {
              iVar28 = (idx_t)(step_data.sel)->sel_vector[iVar26];
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148[0]._0_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar14 = false;
          }
          else {
            bVar14 = (*(ulong *)(local_148[0]._M_allocated_capacity + (iVar22 >> 6) * 8) >>
                      (iVar22 & 0x3f) & 1) == 0;
          }
          if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar39 = false;
          }
          else {
            bVar39 = (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar21 >> 6] >> (iVar21 & 0x3f) & 1) == 0;
          }
          if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar40 = false;
          }
          else {
            bVar40 = (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar20 >> 6] >> (iVar20 & 0x3f) & 1) == 0;
          }
          if (local_1d0.ptr == (reference)0x0) {
            bVar38 = false;
          }
          else if (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0) {
            bVar38 = true;
          }
          else {
            bVar38 = (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar28 >> 6] >> (iVar28 & 0x3f) & 1) != 0;
          }
          local_1b0 = paVar36;
          if (((bVar14 || bVar39) || bVar40) || (local_1d0.ptr != (reference)0x0 && bVar38 == false)
             ) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar26);
          }
          else {
            puVar5 = (ulong *)(str.length + iVar22 * 0x10);
            uVar30 = *puVar5;
            sliced.length = puVar5[1];
            sliced.offset._0_4_ = (undefined4)uVar30;
            sliced.offset._4_4_ = (undefined4)(uVar30 >> 0x20);
            if (cVar44 == '\0') {
              local_1a0 = *(ulong *)(begin_data.data + iVar21 * 8);
            }
            else {
              local_1a0 = 0;
            }
            if (cVar45 == '\0') {
              local_1a8 = *(ulong *)(end_data.data + iVar20 * 8);
              uVar33 = local_1a8;
            }
            else {
              local_1a8 = uVar30 & 0xffffffff;
              uVar33 = 0;
            }
            lVar34 = 1;
            if (local_1d0.ptr == (reference)0x0) {
LAB_01e18123:
              ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                        ((string_t *)&sliced,(long *)&local_1a0,(long *)&local_1a8);
              bVar14 = true;
            }
            else {
              lVar34 = *(long *)(step_data.data + iVar28 * 8);
              if ((lVar34 < 0) && (local_1a8 = local_1a0, local_1a0 = uVar33, cVar44 != '\0')) {
                local_1a8 = uVar30 & 0xffffffff;
              }
              if ((~bVar38 & lVar34 != 1) == 0) goto LAB_01e18123;
              bVar14 = false;
            }
            uVar33 = local_1a0;
            uVar30 = local_1a8;
            if ((long)local_1a0 < (long)local_1a8) {
              iVar22 = CalculateSliceLength<long>(local_1a0,local_1a8,lVar34,bVar38);
            }
            else {
              iVar22 = 0;
            }
            if (bVar14) {
              input_00.value._4_1_ = sliced.offset._4_1_;
              input_00.value._5_1_ = sliced.offset._5_1_;
              input_00.value._6_1_ = sliced.offset._6_1_;
              input_00.value._7_1_ = sliced.offset._7_1_;
              input_00.value.pointer.length = (undefined4)sliced.offset;
              input_00.value.pointer.ptr = (char *)sliced.length;
              input.value._4_1_ = sliced.offset._4_1_;
              input.value._5_1_ = sliced.offset._5_1_;
              input.value._6_1_ = sliced.offset._6_1_;
              input.value._7_1_ = sliced.offset._7_1_;
              input.value.pointer.length = (undefined4)sliced.offset;
              input.value.pointer.ptr = (char *)sliced.length;
              if (local_1d0.ptr == (reference)0x0) {
                aVar42.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     BlobSliceOperations::SliceValue(result,input_00,uVar33,uVar30);
              }
              else {
                aVar42.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     BlobSliceOperations::SliceValueWithSteps
                               (result,&sel,input,uVar33,uVar30,lVar34,(idx_t *)&local_178);
              }
              *(long *)((long)local_1b0 + -8) = aVar42._0_8_;
              *(char **)local_1b0 = aVar42.pointer.ptr;
            }
            else {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar26);
            }
            local_168 = (TemplatedValidityMask<unsigned_long> *)
                        ((long)&local_168->validity_mask + iVar22);
          }
          paVar36 = local_1b0 + 1;
        }
        if (local_1d0.ptr != (reference)0x0) {
          SelectionVector::SelectionVector((SelectionVector *)&sliced,(idx_t)local_168);
          for (pTVar29 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar31 != pTVar29;
              pTVar29 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar29->validity_mask + 1))
          {
            sVar35 = (sel_t)pTVar29;
            if (sel.sel_vector != (sel_t *)0x0) {
              sVar35 = sel.sel_vector[(long)pTVar29];
            }
            *(sel_t *)(CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) + (long)pTVar29 * 4)
                 = sVar35;
          }
          pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
          Vector::Slice(pVVar19,(SelectionVector *)&sliced,(idx_t)pTVar31);
          pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
          Vector::Flatten(pVVar19,(idx_t)pTVar31);
          ListVector::SetListSize(result,(idx_t)pTVar31);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
        }
        UnifiedVectorFormat::~UnifiedVectorFormat(&step_data);
        UnifiedVectorFormat::~UnifiedVectorFormat(&end_data);
        UnifiedVectorFormat::~UnifiedVectorFormat(&begin_data);
        UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      }
      Vector::Verify(result,source_count);
      goto LAB_01e18e6f;
    }
    if (LVar2 != LIST) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&str,"Specifier type not implemented",(allocator *)&begin_data);
      NotImplementedException::NotImplementedException(this_00,(string *)&str);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((result->vector_type & ~CONSTANT_VECTOR) != FLAT_VECTOR) {
      Vector::Flatten(result,source_count);
    }
    if (pvVar16 == (reference)0x0) {
      pVVar19 = (Vector *)0x0;
    }
    else {
      pVVar19 = ListVector::GetEntry(result);
    }
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178 = (data_ptr_t)0x0;
    sel.sel_vector = (sel_t *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if (result->vector_type == CONSTANT_VECTOR) {
      puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = (*puVar3 & 1) == 0;
      }
      puVar3 = (pvVar15->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        bVar39 = false;
      }
      else {
        bVar39 = (*puVar3 & 1) == 0;
      }
      puVar3 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        bVar40 = false;
      }
      else {
        bVar40 = (*puVar3 & 1) == 0;
      }
      end_data.sel = (SelectionVector *)pVVar19;
      if (pvVar16 == (reference)0x0) {
        bVar32 = 0;
        begin_data.sel = (SelectionVector *)pvVar16;
      }
      else {
        begin_data.sel = (SelectionVector *)pvVar16;
        pVVar19 = optional_ptr<duckdb::Vector,_true>::operator*
                            ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
        puVar3 = (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar32 = 1;
        }
        else {
          bVar32 = (byte)*puVar3 & 1;
        }
      }
      if (((bVar14 || bVar39) || bVar40) ||
         (begin_data.sel != (SelectionVector *)0x0 && bVar32 == 0)) {
        ConstantVector::SetNull(result,true);
      }
      else {
        plVar9 = (list_entry_t *)result->data;
        puVar10 = (uint64_t *)pvVar15->data;
        puVar11 = (uint64_t *)this->data;
        if (begin_data.sel == (SelectionVector *)0x0) {
          plVar23 = (long *)0x0;
        }
        else {
          pVVar19 = optional_ptr<duckdb::Vector,_true>::operator*
                              ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          plVar23 = (long *)pVVar19->data;
        }
        str.length = plVar9->length;
        str.offset._0_4_ = (undefined4)plVar9->offset;
        str.offset._4_4_ = (undefined4)(plVar9->offset >> 0x20);
        if (cVar44 == '\0') {
          step_data.sel = (SelectionVector *)*puVar10;
        }
        else {
          step_data.sel = (SelectionVector *)0x0;
        }
        if (cVar45 == '\0') {
          pSVar25 = (SelectionVector *)*puVar11;
          pSVar24 = pSVar25;
        }
        else {
          pSVar25 = (SelectionVector *)0x0;
          pSVar24 = (SelectionVector *)str.length;
        }
        sliced.offset._0_4_ = SUB84(pSVar24,0);
        sliced.offset._4_4_ = (undefined4)((ulong)pSVar24 >> 0x20);
        bVar14 = true;
        if (plVar23 == (long *)0x0) {
          lVar34 = 1;
          bVar39 = true;
LAB_01e19114:
          ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>
                    (&str,(long *)&step_data,(long *)&sliced);
        }
        else {
          lVar34 = *plVar23;
          if (lVar34 < 0) {
            if (cVar44 != '\0') {
              step_data.sel = (SelectionVector *)str.length;
            }
            sliced.offset._0_4_ = SUB84(step_data.sel,0);
            sliced.offset._4_4_ = (undefined4)((ulong)step_data.sel >> 0x20);
            step_data.sel = pSVar25;
          }
          bVar39 = lVar34 == 1;
          if ((bVar32 | bVar39) == 1) goto LAB_01e19114;
          bVar14 = false;
          bVar39 = false;
        }
        if ((bVar32 == 1 && lVar34 != 1) &&
           ((long)step_data.sel < (long)CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))) {
          iVar26 = CalculateSliceLength<long>
                             ((idx_t)step_data.sel,
                              CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar34,true);
          bVar40 = true;
          SelectionVector::Initialize(&sel,iVar26);
        }
        else {
          bVar40 = false;
          iVar26 = 0;
        }
        if (bVar14) {
          if (bVar39) {
            lVar43.length =
                 CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) - (long)step_data.sel;
            lVar43.offset =
                 (long)&(step_data.sel)->sel_vector +
                 (long)&((SelectionVector *)CONCAT44(str.offset._4_4_,(undefined4)str.offset))->
                        sel_vector;
          }
          else {
            input_08.length = (uint64_t)step_data.sel;
            input_08.offset = str.length;
            lVar43 = ListSliceOperations::SliceValueWithSteps
                               ((ListSliceOperations *)result,(Vector *)&sel,
                                (SelectionVector *)CONCAT44(str.offset._4_4_,(undefined4)str.offset)
                                ,input_08,CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),
                                lVar34,(int64_t)&local_178,
                                (idx_t *)CONCAT17(cVar45,CONCAT16(cVar44,in_stack_fffffffffffffe18))
                               );
          }
          *plVar9 = lVar43;
        }
        else {
          ConstantVector::SetNull(result,true);
        }
        if (bVar40) {
          pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->
                              ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          Vector::Slice(pVVar19,&sel,iVar26);
          pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->
                              ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          Vector::Flatten(pVVar19,iVar26);
          ListVector::SetListSize(result,iVar26);
        }
      }
    }
    else {
      local_1d0.ptr = pvVar16;
      local_170.ptr = pVVar19;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
      UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
      UnifiedVectorFormat::UnifiedVectorFormat(&step_data);
      Vector::ToUnifiedFormat(result,source_count,(UnifiedVectorFormat *)&str);
      Vector::ToUnifiedFormat(pvVar15,source_count,&begin_data);
      Vector::ToUnifiedFormat(this,source_count,&end_data);
      if (local_1d0.ptr != (reference)0x0) {
        pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->(&local_1d0);
        Vector::ToUnifiedFormat(pVVar19,source_count,&step_data);
        iVar26 = ListVector::GetListSize(result);
        SelectionVector::Initialize(&sel,iVar26);
      }
      pdVar4 = result->data;
      FlatVector::VerifyFlatVector(result);
      local_168 = &(result->validity).super_TemplatedValidityMask<unsigned_long>;
      paVar36 = (anon_union_16_2_67f50693_for_value *)(pdVar4 + 8);
      local_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      for (iVar26 = 0; count._M_pi = local_160._M_pi, source_count != iVar26; iVar26 = iVar26 + 1) {
        iVar22 = iVar26;
        if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
          iVar22 = (idx_t)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                   iVar26 * 4);
        }
        iVar21 = iVar26;
        if ((begin_data.sel)->sel_vector != (sel_t *)0x0) {
          iVar21 = (idx_t)(begin_data.sel)->sel_vector[iVar26];
        }
        iVar20 = iVar26;
        if ((end_data.sel)->sel_vector != (sel_t *)0x0) {
          iVar20 = (idx_t)(end_data.sel)->sel_vector[iVar26];
        }
        if (local_1d0.ptr == (reference)0x0) {
          uVar30 = 0;
        }
        else {
          uVar30 = iVar26;
          if ((step_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar30 = (ulong)(step_data.sel)->sel_vector[iVar26];
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148[0]._0_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar14 = false;
        }
        else {
          bVar14 = (*(ulong *)(local_148[0]._M_allocated_capacity + (iVar22 >> 6) * 8) >>
                    (iVar22 & 0x3f) & 1) == 0;
        }
        if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar39 = false;
        }
        else {
          bVar39 = (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar21 >> 6] >> (iVar21 & 0x3f) & 1) == 0;
        }
        if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar40 = false;
        }
        else {
          bVar40 = (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar20 >> 6] >> (iVar20 & 0x3f) & 1) == 0;
        }
        if (local_1d0.ptr == (reference)0x0) {
          bVar38 = false;
        }
        else if (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) {
          bVar38 = true;
        }
        else {
          bVar38 = (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0;
        }
        local_1b0 = paVar36;
        if (((bVar14 || bVar39) || bVar40) || (local_1d0.ptr != (reference)0x0 && bVar38 == false))
        {
          TemplatedValidityMask<unsigned_long>::SetInvalid(local_168,iVar26);
        }
        else {
          puVar1 = (undefined8 *)(str.length + iVar22 * 0x10);
          uVar12 = *puVar1;
          sliced.length = puVar1[1];
          sliced.offset._0_4_ = (undefined4)uVar12;
          sliced.offset._4_4_ = (undefined4)((ulong)uVar12 >> 0x20);
          if (cVar44 == '\0') {
            local_1a0 = *(ulong *)(begin_data.data + iVar21 * 8);
          }
          else {
            local_1a0 = 0;
          }
          if (cVar45 == '\0') {
            local_1a8 = *(ulong *)(end_data.data + iVar20 * 8);
            uVar37 = local_1a8;
          }
          else {
            local_1a8 = sliced.length;
            uVar37 = 0;
          }
          local_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
          if (local_1d0.ptr == (reference)0x0) {
LAB_01e18982:
            ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>
                      (&sliced,(long *)&local_1a0,(long *)&local_1a8);
            bVar14 = true;
            uVar30 = extraout_RDX;
          }
          else {
            local_180._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(step_data.data + uVar30 * 8);
            if (((long)local_180._M_pi < 0) &&
               (local_1a8 = local_1a0, local_1a0 = uVar37, cVar44 != '\0')) {
              local_1a8 = sliced.length;
            }
            if ((~bVar38 & local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1)
                == 0) goto LAB_01e18982;
            bVar14 = false;
          }
          uVar13 = local_1a0;
          uVar33 = local_1a8;
          uVar37 = local_1a8 - local_1a0;
          if (uVar37 == 0 || (long)local_1a8 < (long)local_1a0) {
            iVar22 = 0;
          }
          else {
            iVar22 = CalculateSliceLength<long>(local_1a0,local_1a8,(long)local_180._M_pi,bVar38);
            uVar30 = extraout_RDX_00;
          }
          if (bVar14) {
            if (local_1d0.ptr == (reference)0x0) {
              lVar41.length = uVar30;
              lVar41.offset =
                   (long)&((SelectionVector *)
                          CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))->sel_vector +
                   uVar13;
            }
            else {
              input_07.length = uVar13;
              input_07.offset = sliced.length;
              lVar41 = ListSliceOperations::SliceValueWithSteps
                                 ((ListSliceOperations *)result,(Vector *)&sel,
                                  (SelectionVector *)
                                  CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),input_07,
                                  uVar33,(int64_t)local_180._M_pi,(int64_t)&local_178,
                                  (idx_t *)CONCAT17(cVar45,CONCAT16(cVar44,in_stack_fffffffffffffe18
                                                                   )));
              uVar37 = lVar41.length;
            }
            *(uint64_t *)((long)local_1b0 + -8) = lVar41.offset;
            *(uint64_t *)local_1b0 = uVar37;
          }
          else {
            TemplatedValidityMask<unsigned_long>::SetInvalid(local_168,iVar26);
          }
          local_160._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_160._M_pi)->_vptr__Sp_counted_base + iVar22);
        }
        paVar36 = local_1b0 + 1;
      }
      if (local_1d0.ptr != (reference)0x0) {
        SelectionVector::SelectionVector((SelectionVector *)&sliced,(idx_t)local_160._M_pi);
        for (pTVar31 = (TemplatedValidityMask<unsigned_long> *)0x0;
            (TemplatedValidityMask<unsigned_long> *)count._M_pi != pTVar31;
            pTVar31 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar31->validity_mask + 1)) {
          sVar35 = (sel_t)pTVar31;
          if (sel.sel_vector != (sel_t *)0x0) {
            sVar35 = sel.sel_vector[(long)pTVar31];
          }
          *(sel_t *)(CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) + (long)pTVar31 * 4) =
               sVar35;
        }
        pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
        Vector::Slice(pVVar19,(SelectionVector *)&sliced,(idx_t)count._M_pi);
        pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
        Vector::Flatten(pVVar19,(idx_t)count._M_pi);
        ListVector::SetListSize(result,(idx_t)count._M_pi);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&step_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&end_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&begin_data);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&str);
    }
    Vector::Verify(result,source_count);
    goto LAB_01e18e6f;
  }
  if (pvVar16 == (reference)0x0) {
    pVVar19 = (Vector *)0x0;
  }
  else {
    pVVar19 = ListVector::GetEntry(result);
  }
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178 = (data_ptr_t)0x0;
  sel.sel_vector = (sel_t *)0x0;
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  if (result->vector_type == CONSTANT_VECTOR) {
    puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar3 == (unsigned_long *)0x0) {
      bVar14 = false;
    }
    else {
      bVar14 = (*puVar3 & 1) == 0;
    }
    puVar3 = (pvVar15->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar3 == (unsigned_long *)0x0) {
      bVar39 = false;
    }
    else {
      bVar39 = (*puVar3 & 1) == 0;
    }
    puVar3 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar3 == (unsigned_long *)0x0) {
      bVar40 = false;
    }
    else {
      bVar40 = (*puVar3 & 1) == 0;
    }
    end_data.sel = (SelectionVector *)pVVar19;
    if (pvVar16 == (reference)0x0) {
      bVar32 = 0;
      begin_data.sel = (SelectionVector *)pvVar16;
    }
    else {
      begin_data.sel = (SelectionVector *)pvVar16;
      pVVar19 = optional_ptr<duckdb::Vector,_true>::operator*
                          ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
      puVar3 = (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        bVar32 = 1;
      }
      else {
        bVar32 = (byte)*puVar3 & 1;
      }
    }
    if (((bVar14 || bVar39) || bVar40) || (begin_data.sel != (SelectionVector *)0x0 && bVar32 == 0))
    {
      ConstantVector::SetNull(result,true);
    }
    else {
      paVar36 = (anon_union_16_2_67f50693_for_value *)result->data;
      piVar7 = (int64_t *)pvVar15->data;
      piVar8 = (int64_t *)this->data;
      if (begin_data.sel == (SelectionVector *)0x0) {
        plVar23 = (long *)0x0;
      }
      else {
        pVVar19 = optional_ptr<duckdb::Vector,_true>::operator*
                            ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
        plVar23 = (long *)pVVar19->data;
      }
      str.length = (uint64_t)(paVar36->pointer).ptr;
      str.offset._0_4_ = (undefined4)*(undefined8 *)paVar36;
      str.offset._4_4_ = (undefined4)((ulong)*(undefined8 *)paVar36 >> 0x20);
      if (cVar44 == '\0') {
        pSVar25 = (SelectionVector *)*piVar7;
      }
      else {
        pSVar25 = (SelectionVector *)0x0;
      }
      step_data.sel = pSVar25;
      if (cVar45 == '\0') {
        pSVar24 = (SelectionVector *)*piVar8;
        pSVar27 = pSVar24;
      }
      else {
        pSVar24 = (SelectionVector *)StringSliceOperations::ValueLength((string_t *)&str);
        pSVar27 = (SelectionVector *)0x0;
      }
      sliced.offset._0_4_ = SUB84(pSVar24,0);
      sliced.offset._4_4_ = (undefined4)((ulong)pSVar24 >> 0x20);
      bVar14 = true;
      if (plVar23 == (long *)0x0) {
        lVar34 = 1;
        bVar39 = true;
LAB_01e191bb:
        ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                  ((string_t *)&str,(long *)&step_data,(long *)&sliced);
      }
      else {
        lVar34 = *plVar23;
        if (lVar34 < 0) {
          step_data.sel = pSVar27;
          if (cVar44 != '\0') {
            pSVar25 = (SelectionVector *)StringSliceOperations::ValueLength((string_t *)&str);
          }
          sliced.offset._0_4_ = SUB84(pSVar25,0);
          sliced.offset._4_4_ = (undefined4)((ulong)pSVar25 >> 0x20);
        }
        bVar39 = lVar34 == 1;
        if ((bVar32 | bVar39) == 1) goto LAB_01e191bb;
        bVar14 = false;
        bVar39 = false;
      }
      if ((bVar32 == 1 && lVar34 != 1) &&
         ((long)step_data.sel < (long)CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))) {
        iVar26 = CalculateSliceLength<long>
                           ((idx_t)step_data.sel,
                            CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar34,true);
        bVar40 = true;
        SelectionVector::Initialize(&sel,iVar26);
      }
      else {
        bVar40 = false;
        iVar26 = 0;
      }
      if (bVar14) {
        input_06.value._4_1_ = str.offset._4_1_;
        input_06.value._5_1_ = str.offset._5_1_;
        input_06.value._6_1_ = str.offset._6_1_;
        input_06.value._7_1_ = str.offset._7_1_;
        input_06.value.pointer.length = (undefined4)str.offset;
        input_06.value.pointer.ptr = (char *)str.length;
        input_05.value._4_1_ = str.offset._4_1_;
        input_05.value._5_1_ = str.offset._5_1_;
        input_05.value._6_1_ = str.offset._6_1_;
        input_05.value._7_1_ = str.offset._7_1_;
        input_05.value.pointer.length = (undefined4)str.offset;
        input_05.value.pointer.ptr = (char *)str.length;
        if (bVar39) {
          aVar42.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringSliceOperations::SliceValue
                         (result,input_05,(int64_t)step_data.sel,
                          CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset));
        }
        else {
          aVar42.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringSliceOperations::SliceValueWithSteps
                         (result,&sel,input_06,(int64_t)step_data.sel,
                          CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar34,
                          (idx_t *)&local_178);
        }
        paVar36->pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar42;
      }
      else {
        ConstantVector::SetNull(result,true);
      }
      if (bVar40) {
        pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->
                            ((optional_ptr<duckdb::Vector,_true> *)&end_data);
        Vector::Slice(pVVar19,&sel,iVar26);
        pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->
                            ((optional_ptr<duckdb::Vector,_true> *)&end_data);
        Vector::Flatten(pVVar19,iVar26);
        ListVector::SetListSize(result,iVar26);
      }
    }
  }
  else {
    local_1d0.ptr = pvVar16;
    local_170.ptr = pVVar19;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
    UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
    UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
    UnifiedVectorFormat::UnifiedVectorFormat(&step_data);
    Vector::ToUnifiedFormat(result,source_count,(UnifiedVectorFormat *)&str);
    Vector::ToUnifiedFormat(pvVar15,source_count,&begin_data);
    Vector::ToUnifiedFormat(this,source_count,&end_data);
    if (local_1d0.ptr != (reference)0x0) {
      pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->(&local_1d0);
      Vector::ToUnifiedFormat(pVVar19,source_count,&step_data);
      iVar26 = ListVector::GetListSize(result);
      SelectionVector::Initialize(&sel,iVar26);
    }
    pdVar4 = result->data;
    FlatVector::VerifyFlatVector(result);
    local_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&result->validity;
    paVar36 = (anon_union_16_2_67f50693_for_value *)(pdVar4 + 8);
    pTVar31 = (TemplatedValidityMask<unsigned_long> *)0x0;
    for (iVar26 = 0; source_count != iVar26; iVar26 = iVar26 + 1) {
      iVar22 = iVar26;
      if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
        iVar22 = (idx_t)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                 iVar26 * 4);
      }
      iVar21 = iVar26;
      if ((begin_data.sel)->sel_vector != (sel_t *)0x0) {
        iVar21 = (idx_t)(begin_data.sel)->sel_vector[iVar26];
      }
      iVar20 = iVar26;
      if ((end_data.sel)->sel_vector != (sel_t *)0x0) {
        iVar20 = (idx_t)(end_data.sel)->sel_vector[iVar26];
      }
      if (local_1d0.ptr == (reference)0x0) {
        iVar28 = 0;
      }
      else {
        iVar28 = iVar26;
        if ((step_data.sel)->sel_vector != (sel_t *)0x0) {
          iVar28 = (idx_t)(step_data.sel)->sel_vector[iVar26];
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148[0]._0_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = (*(ulong *)(local_148[0]._M_allocated_capacity + (iVar22 >> 6) * 8) >>
                  (iVar22 & 0x3f) & 1) == 0;
      }
      if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar39 = false;
      }
      else {
        bVar39 = (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar21 >> 6] >> (iVar21 & 0x3f) & 1) == 0;
      }
      if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar40 = false;
      }
      else {
        bVar40 = (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar20 >> 6] >> (iVar20 & 0x3f) & 1) == 0;
      }
      if (local_1d0.ptr == (reference)0x0) {
        bVar38 = false;
      }
      else if (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) {
        bVar38 = true;
      }
      else {
        bVar38 = (step_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar28 >> 6] >> (iVar28 & 0x3f) & 1) != 0;
      }
      if (((bVar14 || bVar39) || bVar40) || (local_1d0.ptr != (reference)0x0 && bVar38 == false)) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  ((TemplatedValidityMask<unsigned_long> *)local_160._M_pi,iVar26);
      }
      else {
        puVar1 = (undefined8 *)(str.length + iVar22 * 0x10);
        uVar12 = *puVar1;
        sliced.length = puVar1[1];
        sliced.offset._0_4_ = (undefined4)uVar12;
        sliced.offset._4_4_ = (undefined4)((ulong)uVar12 >> 0x20);
        if (cVar44 == '\0') {
          iVar22 = *(idx_t *)(begin_data.data + iVar21 * 8);
        }
        else {
          iVar22 = 0;
        }
        local_1a0 = iVar22;
        local_1b0 = paVar36;
        local_168 = pTVar31;
        if (cVar45 == '\0') {
          local_1a8 = *(ulong *)(end_data.data + iVar20 * 8);
          iVar21 = local_1a8;
        }
        else {
          local_1a8 = StringSliceOperations::ValueLength((string_t *)&sliced);
          iVar21 = 0;
        }
        lVar34 = 1;
        if (local_1d0.ptr == (reference)0x0) {
LAB_01e18562:
          ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                    ((string_t *)&sliced,(long *)&local_1a0,(long *)&local_1a8);
          bVar14 = true;
          iVar22 = local_1a0;
        }
        else {
          lVar34 = *(long *)(step_data.data + iVar28 * 8);
          iVar20 = local_1a8;
          if ((lVar34 < 0) && (iVar20 = iVar22, iVar22 = iVar21, local_1a0 = iVar21, cVar44 != '\0')
             ) {
            iVar20 = StringSliceOperations::ValueLength((string_t *)&sliced);
          }
          local_1a8 = iVar20;
          if ((~bVar38 & lVar34 != 1) == 0) goto LAB_01e18562;
          bVar14 = false;
        }
        uVar30 = local_1a8;
        if ((long)iVar22 < (long)local_1a8) {
          iVar21 = CalculateSliceLength<long>(iVar22,local_1a8,lVar34,bVar38);
        }
        else {
          iVar21 = 0;
        }
        if (bVar14) {
          input_02.value._4_1_ = sliced.offset._4_1_;
          input_02.value._5_1_ = sliced.offset._5_1_;
          input_02.value._6_1_ = sliced.offset._6_1_;
          input_02.value._7_1_ = sliced.offset._7_1_;
          input_02.value.pointer.length = (undefined4)sliced.offset;
          input_02.value.pointer.ptr = (char *)sliced.length;
          input_01.value._4_1_ = sliced.offset._4_1_;
          input_01.value._5_1_ = sliced.offset._5_1_;
          input_01.value._6_1_ = sliced.offset._6_1_;
          input_01.value._7_1_ = sliced.offset._7_1_;
          input_01.value.pointer.length = (undefined4)sliced.offset;
          input_01.value.pointer.ptr = (char *)sliced.length;
          if (local_1d0.ptr == (reference)0x0) {
            aVar42.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringSliceOperations::SliceValue(result,input_02,iVar22,uVar30);
          }
          else {
            aVar42.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringSliceOperations::SliceValueWithSteps
                           (result,&sel,input_01,iVar22,uVar30,lVar34,(idx_t *)&local_178);
          }
          *(long *)((long)local_1b0 + -8) = aVar42._0_8_;
          *(char **)local_1b0 = aVar42.pointer.ptr;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)local_160._M_pi,iVar26);
        }
        pTVar31 = (TemplatedValidityMask<unsigned_long> *)((long)&local_168->validity_mask + iVar21)
        ;
        paVar36 = local_1b0;
      }
      paVar36 = paVar36 + 1;
    }
    if (local_1d0.ptr != (reference)0x0) {
      SelectionVector::SelectionVector((SelectionVector *)&sliced,(idx_t)pTVar31);
      for (pTVar29 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar31 != pTVar29;
          pTVar29 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar29->validity_mask + 1)) {
        sVar35 = (sel_t)pTVar29;
        if (sel.sel_vector != (sel_t *)0x0) {
          sVar35 = sel.sel_vector[(long)pTVar29];
        }
        *(sel_t *)(CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) + (long)pTVar29 * 4) =
             sVar35;
      }
      pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
      Vector::Slice(pVVar19,(SelectionVector *)&sliced,(idx_t)pTVar31);
      pVVar19 = optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
      Vector::Flatten(pVVar19,(idx_t)pTVar31);
      ListVector::SetListSize(result,(idx_t)pTVar31);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&step_data);
    UnifiedVectorFormat::~UnifiedVectorFormat(&end_data);
    UnifiedVectorFormat::~UnifiedVectorFormat(&begin_data);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&str);
  }
  Vector::Verify(result,source_count);
LAB_01e18e6f:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void ArraySliceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3 || args.ColumnCount() == 4);
	D_ASSERT(args.data.size() == 3 || args.data.size() == 4);
	auto count = args.size();

	Vector &list_or_str_vector = result;
	// this ensures that we do not change the input chunk
	VectorOperations::Copy(args.data[0], list_or_str_vector, count, 0, 0);

	if (list_or_str_vector.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	Vector &begin_vector = args.data[1];
	Vector &end_vector = args.data[2];

	optional_ptr<Vector> step_vector;
	if (args.ColumnCount() == 4) {
		step_vector = &args.data[3];
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSliceBindData>();
	auto begin_is_empty = info.begin_is_empty;
	auto end_is_empty = info.end_is_empty;

	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
	switch (result.GetType().id()) {
	case LogicalTypeId::LIST: {
		// Share the value dictionary as we are just going to slice it
		if (list_or_str_vector.GetVectorType() != VectorType::FLAT_VECTOR &&
		    list_or_str_vector.GetVectorType() != VectorType::CONSTANT_VECTOR) {
			list_or_str_vector.Flatten(count);
		}
		ExecuteSlice<list_entry_t, int64_t, ListSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                         step_vector, count, begin_is_empty, end_is_empty);
		break;
	}
	case LogicalTypeId::BLOB:
		ExecuteSlice<string_t, int64_t, BlobSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                     step_vector, count, begin_is_empty, end_is_empty);
		break;
	case LogicalTypeId::VARCHAR:
		ExecuteSlice<string_t, int64_t, StringSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                       step_vector, count, begin_is_empty, end_is_empty);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented");
	}
}